

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Resolver.cpp
# Opt level: O0

void __thiscall ResolverImp::~ResolverImp(ResolverImp *this)

{
  bool bVar1;
  ResolverImp *this_local;
  
  ResolverThread::stop(this->rt_);
  bVar1 = std::thread::joinable(&this->t_);
  if (bVar1) {
    std::thread::join();
  }
  std::thread::~thread(&this->t_);
  return;
}

Assistant:

~ResolverImp() {
        rt_.stop();
        if (t_.joinable())
            t_.join();
    }